

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_uwsgi_module.c
# Opt level: O0

char * ngx_http_uwsgi_pass(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  void *pvVar1;
  ngx_conf_t *value_00;
  ngx_array_t **ppnVar2;
  ngx_int_t nVar3;
  ngx_http_upstream_srv_conf_t *pnVar4;
  undefined1 local_188 [8];
  ngx_http_script_compile_t sc;
  ngx_http_core_loc_conf_t *clcf;
  ngx_uint_t n;
  ngx_str_t *url;
  ngx_str_t *value;
  ngx_url_t u;
  size_t add;
  ngx_http_uwsgi_loc_conf_t *uwcf;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  if ((*conf == 0) && (*(long *)((long)conf + 0x220) == 0)) {
    sc._80_8_ = *(long *)(*(long *)((long)cf->ctx + 0x10) + ngx_http_core_module.ctx_index * 8);
    *(code **)(sc._80_8_ + 0x48) = ngx_http_uwsgi_handler;
    pvVar1 = cf->args->elts;
    value_00 = (ngx_conf_t *)((long)pvVar1 + 0x10);
    ppnVar2 = (ngx_array_t **)ngx_http_script_variables_count((ngx_str_t *)value_00);
    if (ppnVar2 == (ngx_array_t **)0x0) {
      nVar3 = ngx_strncasecmp(*(u_char **)((long)pvVar1 + 0x18),"uwsgi://",8);
      if (nVar3 == 0) {
        u.err = (char *)0x8;
      }
      else {
        nVar3 = ngx_strncasecmp(*(u_char **)((long)pvVar1 + 0x18),(u_char *)"suwsgi://",9);
        if (nVar3 == 0) {
          ngx_conf_log_error(1,cf,0,"suwsgi protocol requires SSL support");
          return (char *)0xffffffffffffffff;
        }
        u.err = (char *)0x0;
      }
      memset(&value,0,0xd8);
      value = (ngx_str_t *)(value_00->name + -(long)u.err);
      u.url.len = (size_t)(u.err + *(long *)((long)pvVar1 + 0x18));
      u.port._0_1_ = (byte)u.port & 0xfb | 4;
      pnVar4 = ngx_http_upstream_add(cf,(ngx_url_t *)&value,0);
      *(ngx_http_upstream_srv_conf_t **)conf = pnVar4;
      if (*conf == 0) {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
      else {
        if (*(char *)(*(long *)(sc._80_8_ + 8) + *(long *)sc._80_8_ + -1) == '/') {
          *(ushort *)(sc._80_8_ + 0x18) = *(ushort *)(sc._80_8_ + 0x18) & 0xffdf | 0x20;
        }
        cf_local = (ngx_conf_t *)0x0;
      }
    }
    else {
      memset(local_188,0,0x58);
      sc.flushes = (ngx_array_t **)((long)conf + 0x220);
      sc.lengths = (ngx_array_t **)((long)conf + 0x228);
      sc.main._0_1_ = (byte)sc.main & 0xf9 | 6;
      local_188 = (undefined1  [8])cf;
      sc.cf = value_00;
      sc.values = ppnVar2;
      nVar3 = ngx_http_script_compile((ngx_http_script_compile_t *)local_188);
      if (nVar3 == 0) {
        cf_local = (ngx_conf_t *)0x0;
      }
      else {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
    }
  }
  else {
    cf_local = (ngx_conf_t *)anon_var_dwarf_1243;
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_uwsgi_pass(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_uwsgi_loc_conf_t *uwcf = conf;

    size_t                      add;
    ngx_url_t                   u;
    ngx_str_t                  *value, *url;
    ngx_uint_t                  n;
    ngx_http_core_loc_conf_t   *clcf;
    ngx_http_script_compile_t   sc;

    if (uwcf->upstream.upstream || uwcf->uwsgi_lengths) {
        return "is duplicate";
    }

    clcf = ngx_http_conf_get_module_loc_conf(cf, ngx_http_core_module);
    clcf->handler = ngx_http_uwsgi_handler;

    value = cf->args->elts;

    url = &value[1];

    n = ngx_http_script_variables_count(url);

    if (n) {

        ngx_memzero(&sc, sizeof(ngx_http_script_compile_t));

        sc.cf = cf;
        sc.source = url;
        sc.lengths = &uwcf->uwsgi_lengths;
        sc.values = &uwcf->uwsgi_values;
        sc.variables = n;
        sc.complete_lengths = 1;
        sc.complete_values = 1;

        if (ngx_http_script_compile(&sc) != NGX_OK) {
            return NGX_CONF_ERROR;
        }

#if (NGX_HTTP_SSL)
        uwcf->ssl = 1;
#endif

        return NGX_CONF_OK;
    }

    if (ngx_strncasecmp(url->data, (u_char *) "uwsgi://", 8) == 0) {
        add = 8;

    } else if (ngx_strncasecmp(url->data, (u_char *) "suwsgi://", 9) == 0) {

#if (NGX_HTTP_SSL)
        add = 9;
        uwcf->ssl = 1;
#else
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "suwsgi protocol requires SSL support");
        return NGX_CONF_ERROR;
#endif

    } else {
        add = 0;
    }

    ngx_memzero(&u, sizeof(ngx_url_t));

    u.url.len = url->len - add;
    u.url.data = url->data + add;
    u.no_resolve = 1;

    uwcf->upstream.upstream = ngx_http_upstream_add(cf, &u, 0);
    if (uwcf->upstream.upstream == NULL) {
        return NGX_CONF_ERROR;
    }

    if (clcf->name.data[clcf->name.len - 1] == '/') {
        clcf->auto_redirect = 1;
    }

    return NGX_CONF_OK;
}